

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O1

void __thiscall
pbrt::HaltonSampler::HaltonSampler
          (HaltonSampler *this,int samplesPerPixel,Point2i *fullRes,
          RandomizeStrategy randomizeStrategy,int seed,Allocator alloc)

{
  uint uVar1;
  ulong uVar2;
  vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_> *pvVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  int64_t y;
  int64_t x;
  int64_t local_30;
  long local_28;
  
  this->samplesPerPixel = samplesPerPixel;
  this->randomizeStrategy = randomizeStrategy;
  iVar8 = 0;
  this->haltonIndex = 0;
  this->dimension = 0;
  this->digitPermutations =
       (vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_> *)
       0x0;
  (this->baseScales).super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)0x0;
  (this->baseExponents).super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)0x0;
  if (randomizeStrategy == PermuteDigits) {
    pvVar3 = ComputeRadicalInversePermutations(seed,alloc);
    this->digitPermutations = pvVar3;
  }
  do {
    uVar2 = (ulong)(iVar8 != 0);
    iVar6 = (&(fullRes->super_Tuple2<pbrt::Point2,_int>).x)[uVar2];
    iVar5 = 0x80;
    if (iVar6 < 0x80) {
      iVar5 = iVar6;
    }
    if (iVar6 < 2) {
      iVar6 = 0;
      iVar7 = 1;
    }
    else {
      iVar7 = 1;
      iVar6 = 0;
      do {
        iVar7 = iVar7 * (iVar8 == 0 ^ 3);
        iVar6 = iVar6 + 1;
      } while (iVar7 < iVar5);
    }
    this->multInverse[uVar2 - 4] = iVar7;
    this->multInverse[uVar2 - 2] = iVar6;
    bVar9 = iVar8 == 0;
    iVar8 = iVar8 + 1;
  } while (bVar9);
  uVar1 = (this->baseScales).super_Tuple2<pbrt::Point2,_int>.x;
  extendedGCD((long)(this->baseScales).super_Tuple2<pbrt::Point2,_int>.y,(long)(int)uVar1,&local_28,
              &local_30);
  lVar4 = local_28 % (long)(int)uVar1;
  this->multInverse[0] = (int)lVar4 + ((uint)(lVar4 >> 0x3f) & uVar1);
  uVar1 = (this->baseScales).super_Tuple2<pbrt::Point2,_int>.y;
  extendedGCD((long)(this->baseScales).super_Tuple2<pbrt::Point2,_int>.x,(long)(int)uVar1,&local_28,
              &local_30);
  local_28 = local_28 % (long)(int)uVar1;
  this->multInverse[1] = (int)local_28 + ((uint)(local_28 >> 0x3f) & uVar1);
  return;
}

Assistant:

HaltonSampler::HaltonSampler(int samplesPerPixel, const Point2i &fullRes,
                             RandomizeStrategy randomizeStrategy, int seed,
                             Allocator alloc)
    : samplesPerPixel(samplesPerPixel), randomizeStrategy(randomizeStrategy) {
    if (randomizeStrategy == RandomizeStrategy::PermuteDigits)
        digitPermutations = ComputeRadicalInversePermutations(seed, alloc);
    // Find radical inverse base scales and exponents that cover sampling area
    for (int i = 0; i < 2; ++i) {
        int base = (i == 0) ? 2 : 3;
        int scale = 1, exp = 0;
        while (scale < std::min(fullRes[i], MaxHaltonResolution)) {
            scale *= base;
            ++exp;
        }
        baseScales[i] = scale;
        baseExponents[i] = exp;
    }

    // Compute multiplicative inverses for _baseScales_
    multInverse[0] = multiplicativeInverse(baseScales[1], baseScales[0]);
    multInverse[1] = multiplicativeInverse(baseScales[0], baseScales[1]);
}